

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QDBusPlatformMenuItem ** __thiscall
QHash<int,_QDBusPlatformMenuItem_*>::operator[](QHash<int,_QDBusPlatformMenuItem_*> *this,int *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<int,QDBusPlatformMenuItem*>::tryEmplace_impl<int_const&>
            (&local_28,(QHash<int,QDBusPlatformMenuItem*> *)this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDBusPlatformMenuItem **)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }